

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.cpp
# Opt level: O2

bool __thiscall rw::BBox::containsPoint(BBox *this,V3d *point)

{
  if (((((float)(this->inf).x <= (float)point->x) && ((float)point->x <= (float)(this->sup).x)) &&
      ((float)(this->inf).y <= (float)point->y)) &&
     (((float)point->y <= (float)(this->sup).y && ((float)(this->inf).z <= (float)point->z)))) {
    return (float)point->z <= (float)(this->sup).z;
  }
  return false;
}

Assistant:

bool
BBox::containsPoint(V3d *point)
{
	return point->x >= this->inf.x && point->x <= this->sup.x &&
		point->y >= this->inf.y && point->y <= this->sup.y &&
		point->z >= this->inf.z && point->z <= this->sup.z;
}